

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall
ArchiveSpan_WriteSingleElementSpan_Test::TestBody(ArchiveSpan_WriteSingleElementSpan_Test *this)

{
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *pTVar1;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_00;
  int a;
  MatcherBase<pstore::gsl::span<int,__1L>_> local_188;
  ReturnAction<pstore::serialize::archive::void_type> local_170;
  undefined1 local_160 [32];
  MatcherBase<const_int_&> local_140;
  mock_span_archive archive;
  
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::mock_span_archive(&archive);
  local_140.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_140.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00187b40;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_put
            ((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)&a,&archive,
             (Matcher<const_int_&> *)&local_140);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
           InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *)&a,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                              ,0x145,"archive","put (_)");
  pTVar1 = testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>
           ::Times(pTVar1,1);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::ReturnAction(&local_170);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<pstore::serialize::archive::void_type_(const_int_&)> *)local_160,
             (ReturnAction *)&local_170);
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::WillOnce
            (pTVar1,(Action<pstore::serialize::archive::void_type_(const_int_&)> *)local_160);
  std::_Function_base::~_Function_base((_Function_base *)local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_170.value_.
              super___shared_ptr<pstore::serialize::archive::void_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_188);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_140);
  local_160._8_8_ =
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_160._0_8_ = &PTR__MatcherBase_00187ef8;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_putn_mock
            ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)&a,
             &archive,(Matcher<pstore::gsl::span<int,__1L>_> *)local_160);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
                                *)&a,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x146,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_00,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase(&local_188);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)local_160);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            ((UntypedFunctionMockerBase *)&archive,&archive,"put");
  testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::Invoke
            (&archive.gmock01_put_280,&a);
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::~mock_span_archive(&archive);
  return;
}

Assistant:

TEST_F (ArchiveSpan, WriteSingleElementSpan) {
    using ::testing::_;
    using ::testing::Return;

    mock_span_archive archive;
    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (archive, put (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (archive, putn_mock (_)).Times (0);

    int a;
    pstore::serialize::write (archive, ::pstore::gsl::span<int, 1> (&a, 1));
}